

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.hpp
# Opt level: O3

string * bitmanip::detail::stringify_impl<unsigned_long>
                   (string *__return_storage_ptr__,unsigned_long *t)

{
  ulong __val;
  bool bVar1;
  char cVar2;
  ulong uVar3;
  string *__str;
  char cVar4;
  
  __val = *t;
  cVar4 = '\x01';
  if (9 < __val) {
    uVar3 = __val;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (uVar3 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001045a7;
      }
      if (uVar3 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001045a7;
      }
      if (uVar3 < 10000) goto LAB_001045a7;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      cVar2 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_001045a7:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((__return_storage_ptr__->_M_dataplus)._M_p,
             (uint)__return_storage_ptr__->_M_string_length,__val);
  return __return_storage_ptr__;
}

Assistant:

auto stringify_impl(const T &t)
{
    if constexpr (std::is_same_v<bool, T>) {
        return std::string{t ? "true" : "false"};
    }
    else if constexpr (std::is_same_v<T, std::nullptr_t>) {
        return std::string{"nullptr"};
    }
    else if constexpr (std::is_integral_v<T>) {
        return std::to_string(t);
    }
    else if constexpr (std::is_floating_point_v<T>) {
        return std::to_string(t);
    }
    else if constexpr (std::is_enum_v<T>) {
        return std::to_string(static_cast<std::underlying_type_t<T>>(t));
    }
    else if constexpr (std::is_same_v<std::string, T>) {
        return t;
    }
    else if constexpr (std::is_same_v<std::string_view, T>) {
        return std::string{t};
    }
    else if constexpr (std::is_same_v<const char *, const T>) {
        return std::string{t};
    }
    else if constexpr (std::is_pointer_v<T>) {
        return std::to_string(reinterpret_cast<std::uintptr_t>(t));
    }
    else if constexpr (detail::isStaticCastable<T, std::string>) {
        return static_cast<std::string>(t);
    }
}